

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O1

void __thiscall
BCL::
Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
::set(Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
      *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,uint64_t rank)

{
  BCL *pBVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  runtime_error *this_00;
  size_t in_R8;
  GlobalPtr<char> GVar3;
  GlobalPtr<char> dst;
  serial_ptr<char> ptr;
  serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
  local_31;
  serial_ptr<char> local_30;
  
  pBVar1 = (BCL *)(this->ptr).rank;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->ptr).ptr;
  if ((pBVar1 != (BCL *)0x0 || p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (pBVar1 == my_rank)) {
    local_30.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pBVar1;
    local_30.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
    local_free<char>((GlobalPtr<char> *)&local_30);
  }
  serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
  ::operator()(&local_30,&local_31,val);
  GVar3 = local_malloc<char>(local_30.N);
  dst.rank = GVar3.ptr;
  this->ptr = GVar3;
  if ((char *)GVar3.rank != (char *)0x0 || dst.rank != 0) {
    this->len = local_30.N;
    dst.ptr = local_30.N;
    write<char>((BCL *)local_30.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                (char *)GVar3.rank,dst,in_R8);
    if (local_30.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"BCL Container: ran out of memory");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set(const T &val, uint64_t rank = BCL::rank()) {
      // TODO: memory leak.
      if (this->ptr != nullptr && this->ptr.is_local()) {
        BCL::dealloc(this->ptr);
      }
      serial_ptr <SPT> ptr = Serialize{}(val);
      this->ptr = BCL::alloc <SPT> (ptr.N);
      if (this->ptr == nullptr) {
        throw std::runtime_error("BCL Container: ran out of memory");
      }
      this->len = ptr.N;
      BCL::rput(ptr.ptr.get(), this->ptr, ptr.N);
    }